

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O1

void QWhatsThisPrivate::say(QWidget *widget,QString *text,int x,int y)

{
  QWidgetData *pQVar1;
  int iVar2;
  QWhatsThat *this;
  QScreen *pQVar3;
  QPoint QVar4;
  Representation RVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((text->d).size == 0) goto LAB_003a8249;
  this = (QWhatsThat *)operator_new(0x78);
  QWhatsThat::QWhatsThat(this,text,(QWidget *)0x0,widget);
  if (widget == (QWidget *)0x0) {
    local_40.yp.m_i = y;
    local_40.xp.m_i = x;
    pQVar3 = (QScreen *)QGuiApplication::screenAt(&local_40);
  }
  else {
    pQVar3 = QWidget::screen(widget);
  }
  if (pQVar3 == (QScreen *)0x0) {
    QGuiApplication::primaryScreen();
  }
  auVar11 = QScreen::geometry();
  pQVar1 = (this->super_QWidget).data;
  iVar7 = (pQVar1->crect).y2.m_i;
  iVar10 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
  iVar8 = (pQVar1->crect).y1.m_i;
  if (widget == (QWidget *)0x0) {
    QVar4.xp.m_i = 0;
    QVar4.yp.m_i = 0;
    RVar5.m_i = 0;
LAB_003a8141:
    local_40.xp.m_i = x - iVar10 / 2;
  }
  else {
    local_40.xp.m_i = 0;
    local_40.yp.m_i = 0;
    QVar4 = QWidget::mapToGlobal(widget,&local_40);
    RVar5 = QVar4.yp.m_i;
    iVar6 = (widget->data->crect).x2.m_i - (widget->data->crect).x1.m_i;
    if (iVar10 <= iVar6 + 0x11) goto LAB_003a8141;
    local_40.xp.m_i = (QVar4.xp.m_i.m_i - iVar10 / 2) + (iVar6 + 1) / 2;
  }
  iVar6 = auVar11._8_4_ + 1;
  iVar9 = auVar11._0_4_;
  if (iVar6 < iVar10 + shadowWidth + local_40.xp.m_i) {
    iVar6 = iVar6 - iVar9;
    iVar2 = iVar6;
    if ((widget != (QWidget *)0x0) &&
       (iVar2 = ((QVar4.xp.m_i.m_i + (widget->data->crect).x2.m_i) - (widget->data->crect).x1.m_i) +
                1, iVar6 < iVar2)) {
      iVar2 = iVar6;
    }
    local_40.xp.m_i = iVar2 - iVar10;
  }
  iVar7 = (iVar7 - iVar8) + 1;
  if (local_40.xp.m_i <= iVar9) {
    local_40.xp.m_i = iVar9;
  }
  if ((widget != (QWidget *)0x0) &&
     (iVar8 = (widget->data->crect).y2.m_i - (widget->data->crect).y1.m_i, iVar8 + 0x11 < iVar7)) {
    iVar8 = iVar8 + 1;
    if (auVar11._12_4_ + 1 < RVar5.m_i + iVar8 + iVar7 + 0xc) {
      y = ((RVar5.m_i - iVar7) - shadowWidth) + 2;
    }
    else {
      y = RVar5.m_i + iVar8 + 2;
    }
  }
  iVar8 = auVar11._12_4_ + 1;
  local_40.yp.m_i = auVar11._4_4_;
  if (iVar8 < shadowWidth + iVar7 + y + 2) {
    iVar8 = iVar8 - local_40.yp.m_i;
    iVar10 = iVar8;
    if ((widget != (QWidget *)0x0) &&
       (iVar10 = ((RVar5.m_i + (widget->data->crect).y2.m_i) - (widget->data->crect).y1.m_i) + 1,
       iVar8 < iVar10)) {
      iVar10 = iVar8;
    }
    iVar10 = iVar10 - iVar7;
  }
  else {
    iVar10 = y + 2;
  }
  if (local_40.yp.m_i < iVar10) {
    local_40.yp.m_i = iVar10;
  }
  QWidget::move((QWidget *)this,&local_40);
  QWidget::show((QWidget *)this);
  QWidget::grabKeyboard((QWidget *)this);
LAB_003a8249:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWhatsThisPrivate::say(QWidget * widget, const QString &text, int x, int y)
{
    if (text.size() == 0)
        return;
    // make a fresh widget, and set it up
    QWhatsThat *whatsThat = new QWhatsThat(text, nullptr, widget);

    // okay, now to find a suitable location
    QScreen *screen = widget ? widget->screen()
                             : QGuiApplication::screenAt(QPoint(x, y));
    if (!screen)
        screen = QGuiApplication::primaryScreen();
    QRect screenRect = screen->geometry();

    int w = whatsThat->width();
    int h = whatsThat->height();
    int sx = screenRect.x();
    int sy = screenRect.y();

    // first try locating the widget immediately above/below,
    // with nice alignment if possible.
    QPoint pos;
    if (widget)
        pos = widget->mapToGlobal(QPoint(0,0));

    if (widget && w > widget->width() + 16)
        x = pos.x() + widget->width()/2 - w/2;
    else
        x = x - w/2;

    // squeeze it in if that would result in part of what's this
    // being only partially visible
    if (x + w  + shadowWidth > sx+screenRect.width()) {
        x = (widget ? qMin(screenRect.width(), pos.x() + widget->width())
                    : screenRect.width())
            - w;
    }

    if (x < sx)
        x = sx;

    if (widget && h > widget->height() + 16) {
        y = pos.y() + widget->height() + 2; // below, two pixels spacing
        // what's this is above or below, wherever there's most space
        if (y + h + 10 > sy + screenRect.height())
            y = pos.y() + 2 - shadowWidth - h; // above, overlap
    }
    y = y + 2;

    // squeeze it in if that would result in part of what's this
    // being only partially visible
    if (y + h + shadowWidth > sy + screenRect.height()) {
        y = (widget ? qMin(screenRect.height(), pos.y() + widget->height())
                    : screenRect.height())
            - h;
    }
    if (y < sy)
        y = sy;

    whatsThat->move(x, y);
    whatsThat->show();
    whatsThat->grabKeyboard();
}